

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O0

nsync_note nsync::nsync_note_new(nsync_note parent,nsync_time abs_deadline)

{
  nsync_note n_00;
  __syscall_slong_t _Var1;
  nsync_time a;
  int iVar2;
  uint uVar3;
  nsync_note n_01;
  nsync_dll_list_ pnVar4;
  __syscall_slong_t in_RCX;
  nsync_time t;
  nsync_time t_00;
  nsync_time *local_a8;
  nsync_time *local_a0;
  nsync_time parent_time;
  nsync_note n;
  nsync_note parent_local;
  nsync_time abs_deadline_local;
  
  t.tv_sec = abs_deadline.tv_nsec;
  n_01 = (nsync_note)malloc(0x70);
  if (n_01 != (nsync_note)0x0) {
    memset(n_01,0,0x70);
    nsync_dll_init_((nsync_dll_element_ *)n_01,n_01);
    t.tv_nsec = in_RCX;
    set_expiry_time((nsync *)n_01,(nsync_note)abs_deadline.tv_sec,t);
    iVar2 = nsync_note_is_notified(n_01);
    if ((iVar2 == 0) && (parent != (nsync_note)0x0)) {
      nsync_mu_lock(&parent->note_mu);
      uVar3 = std::atomic_load_explicit<unsigned_int>(&parent->notified,memory_order_acquire);
      if (uVar3 == 0) {
        if (parent->expiry_time_valid == 0) {
          local_a8 = (nsync_time *)&nsync_time_no_deadline;
        }
        else {
          local_a8 = &parent->expiry_time;
        }
        local_a0 = local_a8;
      }
      else {
        local_a0 = (nsync_time *)&nsync_time_zero;
      }
      n_00 = (nsync_note)local_a0->tv_sec;
      _Var1 = local_a0->tv_nsec;
      a = *local_a0;
      iVar2 = nsync_time_cmp(*local_a0,abs_deadline);
      if (iVar2 < 0) {
        t_00.tv_nsec = t.tv_sec;
        t_00.tv_sec = _Var1;
        set_expiry_time((nsync *)n_01,n_00,t_00);
      }
      iVar2 = nsync_time_cmp(a,(nsync_time)ZEXT816(0));
      if (0 < iVar2) {
        n_01->parent = parent;
        pnVar4 = nsync_dll_make_last_in_list_(parent->children,(nsync_dll_element_ *)n_01);
        parent->children = pnVar4;
      }
      nsync_mu_unlock(&parent->note_mu);
    }
  }
  return n_01;
}

Assistant:

nsync_note nsync_note_new (nsync_note parent,
			   nsync_time abs_deadline) {
	nsync_note n = (nsync_note) malloc (sizeof (*n));
	if (n != NULL) {
		memset ((void *) n, 0, sizeof (*n));
		nsync_dll_init_ (&n->parent_child_link, n);
		set_expiry_time (n, abs_deadline);
		if (!nsync_note_is_notified (n) && parent != NULL) {
			nsync_time parent_time;
			nsync_mu_lock (&parent->note_mu);
			parent_time = NOTIFIED_TIME (parent);
			if (nsync_time_cmp (parent_time, abs_deadline) < 0) {
				set_expiry_time (n, parent_time);
			}
			if (nsync_time_cmp (parent_time, nsync_time_zero) > 0) {
				n->parent = parent;
				parent->children = nsync_dll_make_last_in_list_ (parent->children,
					&n->parent_child_link);
			}
			nsync_mu_unlock (&parent->note_mu);
		}
	}
	return (n);
}